

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGatherCubeCase::verify
          (TextureGatherCubeCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  bool bVar1;
  const_reference gatherArgs;
  undefined7 extraout_var;
  Vector<float,_3> *local_f8;
  TextureCubeView local_f0;
  TextureCubeView local_b8;
  vector<float,_std::allocator<float>_> local_70;
  undefined1 local_58 [8];
  Vec3 texCoords [4];
  ConstPixelBufferAccess *rendered_local;
  int iterationNdx_local;
  TextureGatherCubeCase *this_local;
  
  local_f8 = (Vector<float,_3> *)local_58;
  do {
    tcu::Vector<float,_3>::Vector(local_f8);
    local_f8 = local_f8 + 1;
  } while (local_f8 != (Vector<float,_3> *)(texCoords[3].m_data + 1));
  (*(this->super_TextureGatherCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[9])
            (&local_70,this,(ulong)ctx & 0xffffffff);
  computeTexCoordVecs<3>(&local_70,(Vector<float,_3> (*) [4])local_58);
  std::vector<float,_std::allocator<float>_>::~vector(&local_70);
  tcu::TextureCube::operator_cast_to_TextureCubeView(&local_f0,&this->m_swizzledTexture);
  getOneLevelSubView(&local_b8,&local_f0,(this->super_TextureGatherCase).m_baseLevel);
  gatherArgs = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration>_>
               ::operator[](&this->m_iterations,(long)(int)ctx);
  bVar1 = (anonymous_namespace)::TextureGatherCase::
          verify<tcu::TextureCubeView,tcu::Vector<float,3>>
                    ((TextureGatherCase *)this,(ConstPixelBufferAccess *)sig,&local_b8,
                     (Vector<float,_3> (*) [4])local_58,&gatherArgs->gatherArgs);
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

bool TextureGatherCubeCase::verify (int iterationNdx, const ConstPixelBufferAccess& rendered) const
{
	Vec3 texCoords[4];
	computeTexCoordVecs(computeQuadTexCoord(iterationNdx), texCoords);
	return TextureGatherCase::verify(rendered, getOneLevelSubView(tcu::TextureCubeView(m_swizzledTexture), m_baseLevel), texCoords, m_iterations[iterationNdx].gatherArgs);
}